

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ExternImpl * __thiscall
slang::BumpAllocator::
emplace<slang::ast::MethodPrototypeSymbol::ExternImpl,slang::ast::SubroutineSymbol_const&>
          (BumpAllocator *this,SubroutineSymbol *args)

{
  ExternImpl *pEVar1;
  
  pEVar1 = (ExternImpl *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ExternImpl *)this->endPtr < pEVar1 + 1) {
    pEVar1 = (ExternImpl *)allocateSlow(this,0x10,8);
  }
  else {
    this->head->current = (byte *)(pEVar1 + 1);
  }
  (pEVar1->impl).ptr = args;
  pEVar1->next = (ExternImpl *)0x0;
  return pEVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }